

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

void __thiscall xmrig::CpuBackend::start(CpuBackend *this,IWorker *worker,bool ready)

{
  bool bVar1;
  byte in_DL;
  long *in_RSI;
  mutex *in_RDI;
  CpuLaunchStatus *unaff_retaddr;
  CpuLaunchStatus *in_stack_00000078;
  
  std::mutex::lock(in_RDI);
  bVar1 = CpuLaunchStatus::started(unaff_retaddr,(IWorker *)in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  if (bVar1) {
    CpuLaunchStatus::print(in_stack_00000078);
  }
  std::mutex::unlock((mutex *)0x1fec40);
  if ((in_DL & 1) != 0) {
    (**(code **)(*in_RSI + 0x40))();
  }
  return;
}

Assistant:

void xmrig::CpuBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(worker, ready)) {
        d_ptr->status.print();
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}